

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel.cpp
# Opt level: O1

int __thiscall QFileSystemModel::remove(QFileSystemModel *this,char *__filename)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QFileInfo fileInfo;
  QDir aQStack_48 [8];
  undefined1 *local_40;
  QString local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QFileSystemModelPrivate::filePath
            (&local_38,*(QFileSystemModelPrivate **)&this->field_0x8,(QModelIndex *)__filename);
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  QFileInfo::QFileInfo((QFileInfo *)&local_40,&local_38);
  cVar2 = QFileInfo::isFile();
  if (cVar2 == '\0') {
    cVar2 = QFileInfo::isSymLink();
    if (cVar2 == '\0') {
      QDir::QDir(aQStack_48,&local_38);
      iVar3 = QDir::removeRecursively();
      bVar1 = true;
      goto LAB_0061e6f6;
    }
  }
  iVar3 = QFile::remove(&local_38);
  bVar1 = false;
LAB_0061e6f6:
  if (bVar1) {
    QDir::~QDir(aQStack_48);
  }
  QFileInfo::~QFileInfo((QFileInfo *)&local_40);
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileSystemModel::remove(const QModelIndex &aindex)
{
    Q_D(QFileSystemModel);

    const QString path = d->filePath(aindex);
    const QFileInfo fileInfo(path);
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    // QTBUG-65683: Remove file system watchers prior to deletion to prevent
    // failure due to locked files on Windows.
    const QStringList watchedPaths = d->unwatchPathsAt(aindex);
#endif // filesystemwatcher && Q_OS_WIN
    const bool success = (fileInfo.isFile() || fileInfo.isSymLink())
            ? QFile::remove(path) : QDir(path).removeRecursively();
#if QT_CONFIG(filesystemwatcher) && defined(Q_OS_WIN)
    if (!success)
        d->watchPaths(watchedPaths);
#endif // filesystemwatcher && Q_OS_WIN
    return success;
}